

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blk_sse_sum_sse2.c
# Opt level: O1

void aom_get_blk_sse_sum_sse2(int16_t *data,int stride,int bw,int bh,int *x_sum,int64_t *x2_sum)

{
  long lVar1;
  undefined1 (*pauVar2) [16];
  long lVar3;
  int iVar4;
  undefined1 (*pauVar5) [16];
  int iVar6;
  ulong uVar7;
  int i;
  long lVar8;
  undefined1 auVar9 [16];
  int iVar10;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined1 auVar11 [16];
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  undefined1 auVar19 [16];
  
  *x_sum = 0;
  *x2_sum = 0;
  auVar11 = _DAT_005154e0;
  if ((bh & 3U) != 0) {
LAB_003168d1:
    aom_get_blk_sse_sum_c(data,stride,bw,bh,x_sum,x2_sum);
    return;
  }
  if (bw < 0x10) {
    if (bw == 4) {
      iVar10 = bh >> 1;
      if (iVar10 < 1) {
        auVar11 = (undefined1  [16])0x0;
        iVar12 = 0;
        iVar13 = 0;
        iVar14 = 0;
        iVar6 = 0;
      }
      else {
        iVar12 = 0;
        iVar13 = 0;
        iVar14 = 0;
        iVar6 = 0;
        auVar9 = (undefined1  [16])0x0;
        do {
          auVar19._8_8_ = *(undefined8 *)(data + stride);
          auVar19._0_8_ = *(undefined8 *)data;
          auVar11 = pmaddwd(auVar19,_DAT_005154e0);
          iVar12 = iVar12 + auVar11._0_4_;
          iVar13 = iVar13 + auVar11._4_4_;
          iVar14 = iVar14 + auVar11._8_4_;
          iVar6 = iVar6 + auVar11._12_4_;
          auVar19 = pmaddwd(auVar19,auVar19);
          auVar11._0_4_ = auVar9._0_4_ + auVar19._0_4_;
          auVar11._4_4_ = auVar9._4_4_ + auVar19._4_4_;
          auVar11._8_4_ = auVar9._8_4_ + auVar19._8_4_;
          auVar11._12_4_ = auVar9._12_4_ + auVar19._12_4_;
          data = data + stride * 2;
          iVar10 = iVar10 + -1;
          auVar9 = auVar11;
        } while (iVar10 != 0);
      }
      goto LAB_00316ca3;
    }
    if (bw != 8) goto LAB_003168d1;
  }
  else if (bw != 0x10) {
    if (bw == 0x20) {
      if (0x20 < bh) {
        iVar10 = 0;
        iVar12 = 0;
        iVar13 = 0;
        iVar14 = 0;
        lVar1 = 0;
        uVar15 = 0;
        uVar16 = 0;
        uVar17 = 0;
        uVar18 = 0;
        pauVar2 = (undefined1 (*) [16])data;
        do {
          iVar6 = 0x20;
          pauVar5 = pauVar2;
          do {
            auVar9 = *pauVar5;
            auVar19 = pmaddwd(auVar9,_DAT_005154e0);
            iVar10 = iVar10 + auVar19._0_4_;
            iVar12 = iVar12 + auVar19._4_4_;
            iVar13 = iVar13 + auVar19._8_4_;
            iVar14 = iVar14 + auVar19._12_4_;
            auVar9 = pmaddwd(auVar9,auVar9);
            uVar15 = uVar15 + auVar9._0_4_;
            uVar16 = uVar16 + auVar9._4_4_;
            uVar17 = uVar17 + auVar9._8_4_;
            uVar18 = uVar18 + auVar9._12_4_;
            pauVar5 = (undefined1 (*) [16])(*pauVar5 + (long)stride * 2);
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
          lVar1 = lVar1 + 1;
          pauVar2 = pauVar2 + 1;
        } while (lVar1 != 4);
        iVar10 = iVar14 + iVar12 + iVar13 + iVar10;
        *x_sum = iVar10;
        iVar12 = 0;
        iVar13 = 0;
        iVar14 = 0;
        iVar6 = 0;
        lVar3 = (ulong)uVar18 + (ulong)uVar16 + (ulong)uVar17 + (ulong)uVar15;
        *x2_sum = lVar3;
        pauVar2 = (undefined1 (*) [16])(data + (stride << 5));
        lVar1 = 0;
        uVar15 = 0;
        uVar16 = 0;
        uVar17 = 0;
        uVar18 = 0;
        do {
          iVar4 = 0x20;
          pauVar5 = pauVar2;
          do {
            auVar9 = *pauVar5;
            auVar19 = pmaddwd(auVar9,auVar11);
            iVar12 = iVar12 + auVar19._0_4_;
            iVar13 = iVar13 + auVar19._4_4_;
            iVar14 = iVar14 + auVar19._8_4_;
            iVar6 = iVar6 + auVar19._12_4_;
            auVar9 = pmaddwd(auVar9,auVar9);
            uVar15 = uVar15 + auVar9._0_4_;
            uVar16 = uVar16 + auVar9._4_4_;
            uVar17 = uVar17 + auVar9._8_4_;
            uVar18 = uVar18 + auVar9._12_4_;
            pauVar5 = (undefined1 (*) [16])(*pauVar5 + (long)stride * 2);
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
          lVar1 = lVar1 + 1;
          pauVar2 = pauVar2 + 1;
        } while (lVar1 != 4);
        *x_sum = iVar14 + iVar12 + iVar10 + iVar6 + iVar13;
        *x2_sum = (ulong)uVar17 + (ulong)uVar15 + lVar3 + (ulong)uVar18 + (ulong)uVar16;
        return;
      }
      auVar9 = (undefined1  [16])0x0;
      iVar10 = 0;
      iVar12 = 0;
      iVar13 = 0;
      iVar14 = 0;
      lVar1 = 0;
      do {
        pauVar2 = (undefined1 (*) [16])data;
        auVar11 = auVar9;
        iVar6 = bh;
        if (0 < bh) {
          do {
            auVar9 = *pauVar2;
            auVar19 = pmaddwd(auVar9,_DAT_005154e0);
            iVar10 = iVar10 + auVar19._0_4_;
            iVar12 = iVar12 + auVar19._4_4_;
            iVar13 = iVar13 + auVar19._8_4_;
            iVar14 = iVar14 + auVar19._12_4_;
            auVar19 = pmaddwd(auVar9,auVar9);
            auVar9._0_4_ = auVar11._0_4_ + auVar19._0_4_;
            auVar9._4_4_ = auVar11._4_4_ + auVar19._4_4_;
            auVar9._8_4_ = auVar11._8_4_ + auVar19._8_4_;
            auVar9._12_4_ = auVar11._12_4_ + auVar19._12_4_;
            iVar6 = iVar6 + -1;
            pauVar2 = (undefined1 (*) [16])(*pauVar2 + (long)stride * 2);
            auVar11 = auVar9;
          } while (iVar6 != 0);
        }
        lVar1 = lVar1 + 1;
        data = (int16_t *)((long)data + 0x10);
      } while (lVar1 != 4);
    }
    else {
      if (bw != 0x40) goto LAB_003168d1;
      lVar1 = (long)stride;
      if (0x10 < bh) {
        iVar10 = *x_sum;
        lVar3 = *x2_sum;
        uVar7 = 0;
        do {
          lVar8 = 0;
          iVar12 = 0;
          iVar13 = 0;
          iVar14 = 0;
          iVar6 = 0;
          uVar15 = 0;
          uVar16 = 0;
          uVar17 = 0;
          uVar18 = 0;
          pauVar2 = (undefined1 (*) [16])data;
          do {
            iVar4 = 0x10;
            pauVar5 = pauVar2;
            do {
              auVar9 = *pauVar5;
              auVar19 = pmaddwd(auVar9,auVar11);
              iVar12 = iVar12 + auVar19._0_4_;
              iVar13 = iVar13 + auVar19._4_4_;
              iVar14 = iVar14 + auVar19._8_4_;
              iVar6 = iVar6 + auVar19._12_4_;
              auVar9 = pmaddwd(auVar9,auVar9);
              uVar15 = uVar15 + auVar9._0_4_;
              uVar16 = uVar16 + auVar9._4_4_;
              uVar17 = uVar17 + auVar9._8_4_;
              uVar18 = uVar18 + auVar9._12_4_;
              pauVar5 = (undefined1 (*) [16])(*pauVar5 + lVar1 * 2);
              iVar4 = iVar4 + -1;
            } while (iVar4 != 0);
            lVar8 = lVar8 + 1;
            pauVar2 = pauVar2 + 1;
          } while (lVar8 != 8);
          iVar10 = iVar10 + iVar6 + iVar13 + iVar14 + iVar12;
          *x_sum = iVar10;
          lVar3 = lVar3 + (ulong)uVar18 + (ulong)uVar16 + (ulong)uVar17 + (ulong)uVar15;
          *x2_sum = lVar3;
          uVar7 = uVar7 + 0x10;
          data = (int16_t *)((long)data + lVar1 * 2 * 0x10);
        } while (uVar7 < (uint)bh);
        return;
      }
      auVar9 = (undefined1  [16])0x0;
      iVar10 = 0;
      iVar12 = 0;
      iVar13 = 0;
      iVar14 = 0;
      lVar3 = 0;
      do {
        pauVar2 = (undefined1 (*) [16])data;
        auVar11 = auVar9;
        iVar6 = bh;
        if (0 < bh) {
          do {
            auVar9 = *pauVar2;
            auVar19 = pmaddwd(auVar9,_DAT_005154e0);
            iVar10 = iVar10 + auVar19._0_4_;
            iVar12 = iVar12 + auVar19._4_4_;
            iVar13 = iVar13 + auVar19._8_4_;
            iVar14 = iVar14 + auVar19._12_4_;
            auVar19 = pmaddwd(auVar9,auVar9);
            auVar9._0_4_ = auVar11._0_4_ + auVar19._0_4_;
            auVar9._4_4_ = auVar11._4_4_ + auVar19._4_4_;
            auVar9._8_4_ = auVar11._8_4_ + auVar19._8_4_;
            auVar9._12_4_ = auVar11._12_4_ + auVar19._12_4_;
            iVar6 = iVar6 + -1;
            pauVar2 = (undefined1 (*) [16])(*pauVar2 + lVar1 * 2);
            auVar11 = auVar9;
          } while (iVar6 != 0);
        }
        lVar3 = lVar3 + 1;
        data = (int16_t *)((long)data + 0x10);
      } while (lVar3 != 8);
    }
    *x_sum = iVar14 + iVar12 + iVar13 + iVar10;
    *x2_sum = (ulong)auVar9._12_4_ + (ulong)auVar9._4_4_ +
              (ulong)auVar9._8_4_ + (auVar9._0_8_ & 0xffffffff);
    return;
  }
  if (bw >> 3 < 1) {
    iVar12 = 0;
    iVar13 = 0;
    iVar14 = 0;
    iVar6 = 0;
    auVar11 = (undefined1  [16])0x0;
  }
  else {
    auVar11 = (undefined1  [16])0x0;
    iVar12 = 0;
    iVar13 = 0;
    iVar14 = 0;
    iVar6 = 0;
    uVar7 = 0;
    do {
      pauVar2 = (undefined1 (*) [16])data;
      auVar9 = auVar11;
      iVar10 = bh;
      if (0 < bh) {
        do {
          auVar11 = *pauVar2;
          auVar19 = pmaddwd(auVar11,_DAT_005154e0);
          iVar12 = iVar12 + auVar19._0_4_;
          iVar13 = iVar13 + auVar19._4_4_;
          iVar14 = iVar14 + auVar19._8_4_;
          iVar6 = iVar6 + auVar19._12_4_;
          auVar19 = pmaddwd(auVar11,auVar11);
          auVar11._0_4_ = auVar9._0_4_ + auVar19._0_4_;
          auVar11._4_4_ = auVar9._4_4_ + auVar19._4_4_;
          auVar11._8_4_ = auVar9._8_4_ + auVar19._8_4_;
          auVar11._12_4_ = auVar9._12_4_ + auVar19._12_4_;
          iVar10 = iVar10 + -1;
          pauVar2 = (undefined1 (*) [16])(*pauVar2 + (long)stride * 2);
          auVar9 = auVar11;
        } while (iVar10 != 0);
      }
      uVar7 = uVar7 + 1;
      data = (int16_t *)((long)data + 0x10);
    } while (uVar7 != (uint)(bw >> 3));
  }
LAB_00316ca3:
  *x_sum = iVar6 + iVar13 + iVar14 + iVar12;
  *x2_sum = (ulong)auVar11._12_4_ + (ulong)auVar11._4_4_ +
            (ulong)auVar11._8_4_ + (auVar11._0_8_ & 0xffffffff);
  return;
}

Assistant:

void aom_get_blk_sse_sum_sse2(const int16_t *data, int stride, int bw, int bh,
                              int *x_sum, int64_t *x2_sum) {
  *x_sum = 0;
  *x2_sum = 0;

  if ((bh & 3) == 0) {
    switch (bw) {
      case 4: sse_sum_wd4_sse2(data, stride, bh, x_sum, x2_sum); break;
      case 8:
      case 16:
        sse_sum_wd8_sse2(data, stride, bh, x_sum, x2_sum, bw >> 3);
        break;
        // For widths 32 and 64, the registers may overflow. So compute
        // partial widths at a time.
      case 32:
        if (bh <= 32) {
          sse_sum_wd8_sse2(data, stride, bh, x_sum, x2_sum, bw >> 3);
          break;
        } else {
          sse_sum_wd8_sse2(data, stride, 32, x_sum, x2_sum, bw >> 3);
          sse_sum_wd8_sse2(data + 32 * stride, stride, 32, x_sum, x2_sum,
                           bw >> 3);
          break;
        }

      case 64:
        if (bh <= 16) {
          sse_sum_wd8_sse2(data, stride, bh, x_sum, x2_sum, bw >> 3);
          break;
        } else {
          for (int i = 0; i < bh; i += 16)
            sse_sum_wd8_sse2(data + i * stride, stride, 16, x_sum, x2_sum,
                             bw >> 3);
          break;
        }

      default: aom_get_blk_sse_sum_c(data, stride, bw, bh, x_sum, x2_sum);
    }
  } else {
    aom_get_blk_sse_sum_c(data, stride, bw, bh, x_sum, x2_sum);
  }
}